

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_value * sqlite3VdbeGetValue(Vdbe *v,int iVar,u8 aff)

{
  Mem *pMVar1;
  sqlite3 *db;
  Mem *pTo;
  
  if (v != (Vdbe *)0x0) {
    pMVar1 = v->aVar;
    if ((pMVar1[(long)iVar + -1].flags & 1) == 0) {
      db = v->db;
      pTo = (Mem *)sqlite3DbMallocRaw(db,0x38);
      if (pTo != (Mem *)0x0) {
        (pTo->u).i = 0;
        pTo->n = 0;
        pTo->flags = 0;
        pTo->type = '\0';
        pTo->enc = '\0';
        pTo->xDel = (_func_void_void_ptr *)0x0;
        pTo->zMalloc = (char *)0x0;
        pTo->z = (char *)0x0;
        pTo->r = 0.0;
        pTo->flags = 1;
        pTo->type = '\x05';
        pTo->db = db;
        sqlite3VdbeMemCopy(pTo,pMVar1 + (long)iVar + -1);
        sqlite3VdbeMemStoreType(pTo);
        return pTo;
      }
    }
  }
  return (sqlite3_value *)0x0;
}

Assistant:

SQLITE_PRIVATE sqlite3_value *sqlite3VdbeGetValue(Vdbe *v, int iVar, u8 aff){
  assert( iVar>0 );
  if( v ){
    Mem *pMem = &v->aVar[iVar-1];
    if( 0==(pMem->flags & MEM_Null) ){
      sqlite3_value *pRet = sqlite3ValueNew(v->db);
      if( pRet ){
        sqlite3VdbeMemCopy((Mem *)pRet, pMem);
        sqlite3ValueApplyAffinity(pRet, aff, SQLITE_UTF8);
        sqlite3VdbeMemStoreType((Mem *)pRet);
      }
      return pRet;
    }
  }
  return 0;
}